

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_collective.cpp
# Opt level: O1

void __thiscall MxxColl_ScattervConvenience_Test::TestBody(MxxColl_ScattervConvenience_Test *this)

{
  pointer piVar1;
  pointer piVar2;
  bool bVar3;
  long lVar4;
  int iVar5;
  char *pcVar6;
  int iVar7;
  long lVar8;
  AssertionResult gtest_ar;
  vector<int,_std::allocator<int>_> result;
  comm c;
  vector<int,_std::allocator<int>_> vec;
  vector<unsigned_long,_std::allocator<unsigned_long>_> sizes;
  AssertHelper local_100;
  vector<int,_std::allocator<int>_> local_f8;
  undefined1 local_d8 [16];
  pointer piStack_c8;
  bool local_c0;
  vector<int,_std::allocator<int>_> local_b0;
  comm local_98;
  vector<int,_std::allocator<int>_> local_78;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_58;
  unsigned_long local_38;
  
  local_d8._0_8_ = &ompi_mpi_comm_world;
  mxx::comm::comm(&local_98,(MPI_Comm *)local_d8);
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((local_98.m_rank == 0) &&
     (std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                (&local_58,(long)local_98.m_size), 0 < local_98.m_size)) {
    lVar8 = 1;
    iVar7 = 0;
    local_38 = 0;
    do {
      local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[local_38] = local_38 + 1;
      lVar4 = lVar8;
      iVar5 = iVar7;
      local_38 = local_38 + 1;
      do {
        local_d8._0_4_ = iVar5;
        if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&local_78,
                     (iterator)
                     local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,(int *)local_d8);
        }
        else {
          *local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = iVar5;
          local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
        iVar5 = iVar5 + 0xd;
        lVar4 = lVar4 + -1;
      } while (lVar4 != 0);
      lVar8 = lVar8 + 1;
      iVar7 = iVar7 + -0x17;
    } while ((long)local_38 < (long)local_98.m_size);
  }
  std::vector<int,_std::allocator<int>_>::vector
            (&local_b0,(long)local_98.m_rank + 1,(allocator_type *)local_d8);
  lVar8 = (long)local_98.m_rank;
  if (lVar8 == 0) {
    mxx::scatterv<int>(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start,&local_58,
                       local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start,1,0,&local_98);
  }
  else {
    local_100.data_ = (AssertHelperData *)&ompi_mpi_comm_world;
    mxx::comm::comm((comm *)local_d8,(MPI_Comm *)&local_100);
    mxx::scatterv_recv<int>(&local_f8,lVar8 + 1,0,(comm *)local_d8);
    piVar2 = local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
    piVar1 = local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
    local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
    local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    if ((MPI_Comm)piVar1 != (MPI_Comm)0x0) {
      operator_delete(piVar1,(long)piVar2 - (long)piVar1);
    }
    if ((MPI_Comm)
        local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (MPI_Comm)0x0) {
      operator_delete(local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    mxx::comm::~comm((comm *)local_d8);
  }
  if (0 < (int)((ulong)((long)local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 2)) {
    lVar8 = 0;
    iVar7 = 0;
    lVar4 = 0;
    do {
      local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)CONCAT44(local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start._4_4_,
                                   local_98.m_rank * -0x17 + iVar7);
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_d8,"13*j+-23*c.rank()","result[j]",(int *)&local_f8,
                 (int *)((long)local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar8));
      if (local_d8[0] == (allocator_type)0x0) {
        testing::Message::Message((Message *)&local_f8);
        if ((MPI_Comm)local_d8._8_8_ == (MPI_Comm)0x0) {
          pcVar6 = "";
        }
        else {
          pcVar6 = *(char **)(pointer)local_d8._8_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_100,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_collective.cpp"
                   ,0xb0,pcVar6);
        testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_f8);
        testing::internal::AssertHelper::~AssertHelper(&local_100);
        if ((MPI_Comm)
            local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (MPI_Comm)0x0) {
          bVar3 = testing::internal::IsTrue(true);
          if ((bVar3) &&
             ((MPI_Comm)
              local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start != (MPI_Comm)0x0)) {
            (**(code **)(*(undefined **)
                          local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start + 8))();
          }
          local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)(local_d8 + 8),
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        goto LAB_0010cd2e;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(local_d8 + 8),
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      lVar4 = lVar4 + 1;
      iVar7 = iVar7 + 0xd;
      lVar8 = lVar8 + 4;
    } while (lVar4 < (int)((ulong)((long)local_b0.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_b0.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start) >> 2));
  }
  mxx::scatterv<int>((vector<int,_std::allocator<int>_> *)local_d8,
                     local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,&local_58,(long)local_98.m_rank + 1,0,
                     &local_98);
  piVar2 = local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  piVar1 = local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)local_d8._0_8_;
  local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)local_d8._8_8_;
  local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = piStack_c8;
  local_d8._0_8_ = (MPI_Comm)0x0;
  local_d8._8_8_ = (MPI_Comm)0x0;
  piStack_c8 = (pointer)0x0;
  if ((MPI_Comm)piVar1 != (MPI_Comm)0x0) {
    operator_delete(piVar1,(long)piVar2 - (long)piVar1);
  }
  if ((MPI_Comm)local_d8._0_8_ != (MPI_Comm)0x0) {
    operator_delete((void *)local_d8._0_8_,(long)piStack_c8 - local_d8._0_8_);
  }
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,local_98.m_rank + 1);
  local_100.data_._0_4_ =
       (int)((ulong)((long)local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 2);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_d8,"c.rank()+1","(int)result.size()",(int *)&local_f8,
             (int *)&local_100);
  if (local_d8[0] == (allocator_type)0x0) {
    testing::Message::Message((Message *)&local_f8);
    if ((MPI_Comm)local_d8._8_8_ == (MPI_Comm)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)(pointer)local_d8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_collective.cpp"
               ,0xb5,pcVar6);
    testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    if ((MPI_Comm)
        local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (MPI_Comm)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((MPI_Comm)
          local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (MPI_Comm)0x0)) {
        (**(code **)(*(undefined **)
                      local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start + 8))();
      }
      local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_d8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         );
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_d8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         );
    if (0 < (int)((ulong)((long)local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start) >> 2)) {
      lVar8 = 0;
      iVar7 = 0;
      lVar4 = 0;
      do {
        local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)CONCAT44(local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._4_4_,
                                     local_98.m_rank * -0x17 + iVar7);
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_d8,"13*j-23*c.rank()","result[j]",(int *)&local_f8,
                   (int *)((long)local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start + lVar8));
        if (local_d8[0] == (allocator_type)0x0) {
          testing::Message::Message((Message *)&local_f8);
          if ((MPI_Comm)local_d8._8_8_ == (MPI_Comm)0x0) {
            pcVar6 = "";
          }
          else {
            pcVar6 = *(char **)(pointer)local_d8._8_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_100,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_collective.cpp"
                     ,0xb7,pcVar6);
          testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_f8);
          testing::internal::AssertHelper::~AssertHelper(&local_100);
          if ((MPI_Comm)
              local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start != (MPI_Comm)0x0) {
            bVar3 = testing::internal::IsTrue(true);
            if ((bVar3) &&
               ((MPI_Comm)
                local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != (MPI_Comm)0x0)) {
              (**(code **)(*(undefined **)
                            local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + 8))();
            }
            local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)0x0;
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)(local_d8 + 8),
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          goto LAB_0010cd2e;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)(local_d8 + 8),
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        lVar4 = lVar4 + 1;
        iVar7 = iVar7 + 0xd;
        lVar8 = lVar8 + 4;
      } while (lVar4 < (int)((ulong)((long)local_b0.super__Vector_base<int,_std::allocator<int>_>.
                                           _M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_b0.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_start) >> 2));
    }
    if ((long)local_98.m_rank == 0) {
      mxx::scatterv<int>((vector<int,_std::allocator<int>_> *)local_d8,
                         local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start,&local_58,1,0,&local_98);
      piVar2 = local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      piVar1 = local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)local_d8._0_8_;
      local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)local_d8._8_8_;
      local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = piStack_c8;
      local_d8._0_8_ = (MPI_Comm)0x0;
      local_d8._8_8_ = (MPI_Comm)0x0;
      piStack_c8 = (pointer)0x0;
      if ((MPI_Comm)piVar1 != (MPI_Comm)0x0) {
        operator_delete(piVar1,(long)piVar2 - (long)piVar1);
      }
      if ((MPI_Comm)local_d8._0_8_ != (MPI_Comm)0x0) {
        operator_delete((void *)local_d8._0_8_,(long)piStack_c8 - local_d8._0_8_);
      }
    }
    else {
      std::vector<int,_std::allocator<int>_>::resize(&local_b0,(long)local_98.m_rank + 1);
      piVar1 = local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar8 = (long)local_98.m_rank;
      local_d8._0_8_ = &PTR__comm_00151e50;
      local_d8._8_8_ = &ompi_mpi_comm_world;
      MPI_Comm_size();
      MPI_Comm_rank(local_d8._8_8_);
      local_c0 = false;
      mxx::scatterv_recv<int>(piVar1,lVar8 + 1,0,(comm *)local_d8);
      mxx::comm::~comm((comm *)local_d8);
    }
    local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)CONCAT44(local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start._4_4_,local_98.m_rank + 1);
    local_100.data_._0_4_ =
         (int)((ulong)((long)local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 2);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_d8,"c.rank()+1","(int)result.size()",(int *)&local_f8,
               (int *)&local_100);
    if (local_d8[0] == (allocator_type)0x0) {
      testing::Message::Message((Message *)&local_f8);
      if ((MPI_Comm)local_d8._8_8_ == (MPI_Comm)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = *(char **)(pointer)local_d8._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_100,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_collective.cpp"
                 ,0xbf,pcVar6);
      testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_f8);
      testing::internal::AssertHelper::~AssertHelper(&local_100);
      if ((MPI_Comm)
          local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (MPI_Comm)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) &&
           ((MPI_Comm)
            local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (MPI_Comm)0x0)) {
          (**(code **)(*(undefined **)
                        local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start + 8))();
        }
        local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(local_d8 + 8),
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(local_d8 + 8),
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      if (0 < (int)((ulong)((long)local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                           (long)local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start) >> 2)) {
        lVar8 = 0;
        iVar7 = 0;
        lVar4 = 0;
        do {
          local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)CONCAT44(local_f8.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start._4_4_,
                                       local_98.m_rank * -0x17 + iVar7);
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)local_d8,"13*j-23*c.rank()","result[j]",(int *)&local_f8,
                     (int *)((long)local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start + lVar8));
          if (local_d8[0] == (allocator_type)0x0) {
            testing::Message::Message((Message *)&local_f8);
            if ((MPI_Comm)local_d8._8_8_ == (MPI_Comm)0x0) {
              pcVar6 = "";
            }
            else {
              pcVar6 = *(char **)(pointer)local_d8._8_8_;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_100,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_collective.cpp"
                       ,0xc1,pcVar6);
            testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_f8);
            testing::internal::AssertHelper::~AssertHelper(&local_100);
            if ((MPI_Comm)
                local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != (MPI_Comm)0x0) {
              bVar3 = testing::internal::IsTrue(true);
              if ((bVar3) &&
                 ((MPI_Comm)
                  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (MPI_Comm)0x0)) {
                (**(code **)(*(undefined **)
                              local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start + 8))();
              }
              local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start = (pointer)0x0;
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)(local_d8 + 8),
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            goto LAB_0010cd2e;
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)(local_d8 + 8),
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          lVar4 = lVar4 + 1;
          iVar7 = iVar7 + 0xd;
          lVar8 = lVar8 + 4;
        } while (lVar4 < (int)((ulong)((long)local_b0.super__Vector_base<int,_std::allocator<int>_>.
                                             _M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_b0.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_start) >> 2));
      }
      mxx::scatterv<int>((vector<int,_std::allocator<int>_> *)local_d8,&local_78,&local_58,
                         (long)local_98.m_rank + 1,0,&local_98);
      piVar2 = local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      piVar1 = local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)local_d8._0_8_;
      local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)local_d8._8_8_;
      local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = piStack_c8;
      local_d8._0_8_ = (MPI_Comm)0x0;
      local_d8._8_8_ = (MPI_Comm)0x0;
      piStack_c8 = (pointer)0x0;
      if ((MPI_Comm)piVar1 != (MPI_Comm)0x0) {
        operator_delete(piVar1,(long)piVar2 - (long)piVar1);
      }
      if ((MPI_Comm)local_d8._0_8_ != (MPI_Comm)0x0) {
        operator_delete((void *)local_d8._0_8_,(long)piStack_c8 - local_d8._0_8_);
      }
      local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)CONCAT44(local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start._4_4_,local_98.m_rank + 1);
      local_100.data_._0_4_ =
           (int)((ulong)((long)local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 2);
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_d8,"c.rank()+1","(int)result.size()",(int *)&local_f8,
                 (int *)&local_100);
      if (local_d8[0] == (allocator_type)0x0) {
        testing::Message::Message((Message *)&local_f8);
        if ((MPI_Comm)local_d8._8_8_ == (MPI_Comm)0x0) {
          pcVar6 = "";
        }
        else {
          pcVar6 = *(char **)(pointer)local_d8._8_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_100,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_collective.cpp"
                   ,0xc6,pcVar6);
        testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_f8);
        testing::internal::AssertHelper::~AssertHelper(&local_100);
        if ((MPI_Comm)
            local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (MPI_Comm)0x0) {
          bVar3 = testing::internal::IsTrue(true);
          if ((bVar3) &&
             ((MPI_Comm)
              local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start != (MPI_Comm)0x0)) {
            (**(code **)(*(undefined **)
                          local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start + 8))();
          }
          local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)(local_d8 + 8),
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)(local_d8 + 8),
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        if (0 < (int)((ulong)((long)local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish -
                             (long)local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start) >> 2)) {
          lVar8 = 0;
          iVar7 = 0;
          lVar4 = 0;
          do {
            local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)CONCAT44(local_f8.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_start._4_4_,
                                         local_98.m_rank * -0x17 + iVar7);
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)local_d8,"13*j-23*c.rank()","result[j]",(int *)&local_f8,
                       (int *)((long)local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start + lVar8));
            if (local_d8[0] == (allocator_type)0x0) {
              testing::Message::Message((Message *)&local_f8);
              if ((MPI_Comm)local_d8._8_8_ == (MPI_Comm)0x0) {
                pcVar6 = "";
              }
              else {
                pcVar6 = *(char **)(pointer)local_d8._8_8_;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_100,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_collective.cpp"
                         ,200,pcVar6);
              testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_f8);
              testing::internal::AssertHelper::~AssertHelper(&local_100);
              if ((MPI_Comm)
                  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (MPI_Comm)0x0) {
                bVar3 = testing::internal::IsTrue(true);
                if ((bVar3) &&
                   ((MPI_Comm)
                    local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start != (MPI_Comm)0x0)) {
                  (**(code **)(*(undefined **)
                                local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start + 8))();
                }
                local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)(local_d8 + 8),
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              break;
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)(local_d8 + 8),
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            lVar4 = lVar4 + 1;
            iVar7 = iVar7 + 0xd;
            lVar8 = lVar8 + 4;
          } while (lVar4 < (int)((ulong)((long)local_b0.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_finish -
                                        (long)local_b0.super__Vector_base<int,_std::allocator<int>_>
                                              ._M_impl.super__Vector_impl_data._M_start) >> 2));
        }
      }
    }
  }
LAB_0010cd2e:
  if ((MPI_Comm)
      local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (MPI_Comm)0x0) {
    operator_delete(local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  mxx::comm::~comm(&local_98);
  return;
}

Assistant:

TEST(MxxColl, ScattervConvenience) {
    mxx::comm c = MPI_COMM_WORLD;

    std::vector<int> vec;
    std::vector<size_t> sizes;

    // scatter from 0
    if (c.rank() == 0) {
        sizes.resize(c.size());
        for (int i = 0; i < c.size(); ++i) {
            sizes[i] = i+1;
            for (size_t j = 0; j < (size_t)(i+1); ++j)
            {
                vec.push_back(13*j + -23*i);
            }
        }
    }

    // test general case with recv
    std::vector<int> result(c.rank()+1);
    if (c.rank() == 0)
        mxx::scatterv(&vec[0], sizes, &result.front(), c.rank()+1, 0, c);
    else
        result = mxx::scatterv_recv<int>(c.rank()+1, 0, MPI_COMM_WORLD);
    for (int j = 0; j < (int)result.size(); ++j) {
        ASSERT_EQ(13*j+-23*c.rank(), result[j]);
    }

    // test convenience functions
    result = mxx::scatterv(&vec[0], sizes, c.rank()+1, 0, c);
    ASSERT_EQ(c.rank()+1, (int)result.size());
    for (int j = 0; j < (int)result.size(); ++j) {
        ASSERT_EQ(13*j-23*c.rank(), result[j]);
    }
    if (c.rank() == 0)
        result = mxx::scatterv(&vec[0], sizes, c.rank()+1, 0, c);
    else {
        result.resize(c.rank() + 1);
        mxx::scatterv_recv(&result.front(), c.rank()+1, 0);
    }
    ASSERT_EQ(c.rank()+1, (int)result.size());
    for (int j = 0; j < (int)result.size(); ++j) {
        ASSERT_EQ(13*j-23*c.rank(), result[j]);
    }

    // test convenience functions
    result = mxx::scatterv(vec, sizes, c.rank()+1, 0, c);
    ASSERT_EQ(c.rank()+1, (int)result.size());
    for (int j = 0; j < (int)result.size(); ++j) {
        ASSERT_EQ(13*j-23*c.rank(), result[j]);
    }
}